

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

ns_connection * ns_add_sock(ns_mgr *s,sock_t sock,ns_callback_t callback,void *user_data)

{
  ns_connection *pnVar1;
  uint uVar2;
  ns_connection *pnVar3;
  time_t tVar4;
  
  pnVar3 = (ns_connection *)calloc(1,0xa0);
  if (pnVar3 != (ns_connection *)0x0) {
    uVar2 = fcntl64(sock,3,0);
    fcntl64(sock,4,uVar2 | 0x800);
    fcntl64(sock,2,1);
    pnVar3->sock = sock;
    pnVar3->user_data = user_data;
    pnVar3->callback = callback;
    pnVar3->mgr = s;
    tVar4 = time((time_t *)0x0);
    pnVar3->last_io_time = tVar4;
    pnVar1 = s->active_connections;
    pnVar3->next = pnVar1;
    s->active_connections = pnVar3;
    if (pnVar1 != (ns_connection *)0x0) {
      pnVar1->prev = pnVar3;
    }
  }
  return pnVar3;
}

Assistant:

struct ns_connection *ns_add_sock(struct ns_mgr *s, sock_t sock,
                                  ns_callback_t callback, void *user_data) {
  struct ns_connection *conn;
  if ((conn = (struct ns_connection *) NS_MALLOC(sizeof(*conn))) != NULL) {
    memset(conn, 0, sizeof(*conn));
    ns_set_non_blocking_mode(sock);
    ns_set_close_on_exec(sock);
    conn->sock = sock;
    conn->user_data = user_data;
    conn->callback = callback;
    conn->mgr = s;
    conn->last_io_time = time(NULL);
    ns_add_conn(s, conn);
    DBG(("%p %d", conn, sock));
  }
  return conn;
}